

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_generic-inl.h
# Opt level: O0

int google::GetStackTrace(void **result,int max_depth,int skip_count)

{
  int local_224;
  int local_220;
  int i;
  int result_count;
  int size;
  void *stack [64];
  int skip_count_local;
  int max_depth_local;
  void **result_local;
  
  stack[0x3f]._0_4_ = skip_count;
  stack[0x3f]._4_4_ = max_depth;
  local_220 = backtrace(&result_count,0x40);
  stack[0x3f]._0_4_ = (int)stack[0x3f] + 1;
  local_220 = local_220 - (int)stack[0x3f];
  if (local_220 < 0) {
    local_220 = 0;
  }
  if (stack[0x3f]._4_4_ < local_220) {
    local_220 = stack[0x3f]._4_4_;
  }
  for (local_224 = 0; local_224 < local_220; local_224 = local_224 + 1) {
    result[local_224] = *(void **)(&result_count + (long)(local_224 + (int)stack[0x3f]) * 2);
  }
  return local_220;
}

Assistant:

int GetStackTrace(void** result, int max_depth, int skip_count) {
  static const int kStackLength = 64;
  void* stack[kStackLength];
  int size;

  size = backtrace(stack, kStackLength);
  skip_count++;  // we want to skip the current frame as well
  int result_count = size - skip_count;
  if (result_count < 0) {
    result_count = 0;
  }
  if (result_count > max_depth) {
    result_count = max_depth;
  }
  for (int i = 0; i < result_count; i++) {
    result[i] = stack[i + skip_count];
  }

  return result_count;
}